

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
::find_or_prepare_insert_non_soo<google::protobuf::Descriptor_const*>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
          *this,Descriptor **key)

{
  ulong uVar1;
  uint uVar2;
  ushort uVar3;
  undefined1 auVar4 [16];
  ctrl_t cVar5;
  ctrl_t cVar6;
  ctrl_t cVar7;
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  char cVar21;
  ushort uVar22;
  ctrl_t *pcVar23;
  slot_type *ppDVar24;
  ctrl_t *pcVar25;
  size_t i;
  uint64_t v;
  anon_union_8_1_a8a14541_for_iterator_2 aVar26;
  ulong uVar27;
  ulong uVar28;
  bool bVar29;
  uint uVar30;
  ulong uVar31;
  size_t cap;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar40 [16];
  iterator iVar41;
  FindInfo FVar42;
  __m128i match;
  ctrl_t cVar34;
  ctrl_t cVar37;
  ctrl_t cVar38;
  ctrl_t cVar39;
  
  if (*(long *)this == 1) {
    __assert_fail("!is_soo()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xede,
                  "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<const google::protobuf::Descriptor *>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<const google::protobuf::Descriptor *>, K = const google::protobuf::Descriptor *]"
                 );
  }
  if (*(long *)this == 0) {
LAB_0028d94e:
    __assert_fail("!kEnabled || cap >= kCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb37,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<const google::protobuf::Descriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<const google::protobuf::Descriptor *>]"
                 );
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::prefetch_heap_block
            ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
              *)this);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = (Descriptor *)((long)&hash_internal::MixingHashState::kSeed + (long)*key);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *key + (SUB168(auVar35 * ZEXT816(0x9ddfea08eb382d69),0) ^
                        SUB168(auVar35 * ZEXT816(0x9ddfea08eb382d69),8));
  uVar1 = *(ulong *)this;
  if ((uVar1 + 1 & uVar1) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x145,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar33 = SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),8) ^
           SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),0);
  uVar31 = (uVar33 >> 7 ^ *(ulong *)(this + 0x10) >> 0xc) & uVar1;
  pcVar23 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ::control((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       *)this);
  auVar35 = ZEXT216(CONCAT11((char)uVar33,(char)uVar33) & 0x7f7f);
  auVar35 = pshuflw(auVar35,auVar35,0);
  iVar41 = __return_storage_ptr__->first;
  bVar29 = __return_storage_ptr__->second;
  uVar27 = 0;
  do {
    pcVar25 = pcVar23 + uVar31;
    cVar5 = *pcVar25;
    cVar6 = pcVar25[1];
    cVar7 = pcVar25[2];
    cVar8 = pcVar25[3];
    cVar9 = pcVar25[4];
    cVar10 = pcVar25[5];
    cVar11 = pcVar25[6];
    cVar12 = pcVar25[7];
    cVar13 = pcVar25[8];
    cVar14 = pcVar25[9];
    cVar15 = pcVar25[10];
    cVar16 = pcVar25[0xb];
    cVar17 = pcVar25[0xc];
    cVar18 = pcVar25[0xd];
    cVar19 = pcVar25[0xe];
    cVar20 = pcVar25[0xf];
    cVar34 = auVar35[0];
    auVar36[0] = -(cVar34 == cVar5);
    cVar37 = auVar35[1];
    auVar36[1] = -(cVar37 == cVar6);
    cVar38 = auVar35[2];
    auVar36[2] = -(cVar38 == cVar7);
    cVar39 = auVar35[3];
    auVar36[3] = -(cVar39 == cVar8);
    auVar36[4] = -(cVar34 == cVar9);
    auVar36[5] = -(cVar37 == cVar10);
    auVar36[6] = -(cVar38 == cVar11);
    auVar36[7] = -(cVar39 == cVar12);
    auVar36[8] = -(cVar34 == cVar13);
    auVar36[9] = -(cVar37 == cVar14);
    auVar36[10] = -(cVar38 == cVar15);
    auVar36[0xb] = -(cVar39 == cVar16);
    auVar36[0xc] = -(cVar34 == cVar17);
    auVar36[0xd] = -(cVar37 == cVar18);
    auVar36[0xe] = -(cVar38 == cVar19);
    auVar36[0xf] = -(cVar39 == cVar20);
    uVar22 = (ushort)(SUB161(auVar36 >> 7,0) & 1) | (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe | (ushort)(auVar36[0xf] >> 7) << 0xf;
    uVar30 = (uint)uVar22;
    pcVar25 = iVar41.ctrl_;
    aVar26 = iVar41.field_1;
    while (uVar22 != 0) {
      uVar2 = 0;
      if (uVar30 != 0) {
        for (; (uVar30 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      ppDVar24 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 ::slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                               *)this);
      uVar32 = uVar2 + uVar31 & uVar1;
      if (ppDVar24[uVar32] == *key) {
        (__return_storage_ptr__->first).field_1 = aVar26;
        __return_storage_ptr__->second = bVar29;
        (__return_storage_ptr__->first).ctrl_ = pcVar25;
        iVar41 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                *)this,uVar32);
        __return_storage_ptr__->first = iVar41;
        __return_storage_ptr__->second = false;
        return __return_storage_ptr__;
      }
      uVar22 = (ushort)(uVar30 - 1) & (ushort)uVar30;
      uVar30 = CONCAT22((short)(uVar30 - 1 >> 0x10),uVar22);
    }
    auVar40[0] = -(cVar5 == kEmpty);
    auVar40[1] = -(cVar6 == kEmpty);
    auVar40[2] = -(cVar7 == kEmpty);
    auVar40[3] = -(cVar8 == kEmpty);
    auVar40[4] = -(cVar9 == kEmpty);
    auVar40[5] = -(cVar10 == kEmpty);
    auVar40[6] = -(cVar11 == kEmpty);
    auVar40[7] = -(cVar12 == kEmpty);
    auVar40[8] = -(cVar13 == kEmpty);
    auVar40[9] = -(cVar14 == kEmpty);
    auVar40[10] = -(cVar15 == kEmpty);
    auVar40[0xb] = -(cVar16 == kEmpty);
    auVar40[0xc] = -(cVar17 == kEmpty);
    auVar40[0xd] = -(cVar18 == kEmpty);
    auVar40[0xe] = -(cVar19 == kEmpty);
    auVar40[0xf] = -(cVar20 == kEmpty);
    uVar22 = (ushort)(SUB161(auVar40 >> 7,0) & 1) | (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe | (ushort)(auVar40[0xf] >> 7) << 0xf;
    uVar32 = *(ulong *)this;
    if (uVar22 == 0) {
      if (uVar32 == 0) goto LAB_0028d93e;
      uVar28 = uVar27 + 0x10;
      if (uVar32 < uVar28) {
        (__return_storage_ptr__->first).field_1 = aVar26;
        __return_storage_ptr__->second = bVar29;
        (__return_storage_ptr__->first).ctrl_ = pcVar25;
        __assert_fail("seq.index() <= capacity() && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xef5,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<const google::protobuf::Descriptor *>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<const google::protobuf::Descriptor *>, K = const google::protobuf::Descriptor *]"
                     );
      }
      uVar31 = uVar31 + uVar27 + 0x10 & uVar1;
    }
    else {
      if (uVar32 == 0) {
LAB_0028d93e:
        (__return_storage_ptr__->first).field_1 = aVar26;
        __return_storage_ptr__->second = bVar29;
        (__return_storage_ptr__->first).ctrl_ = pcVar25;
        goto LAB_0028d94e;
      }
      pcVar25 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                ::control((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                           *)this);
      cVar21 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                         (uVar32,uVar33,pcVar25);
      if (cVar21 == '\0') {
        uVar30 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
          }
        }
      }
      else {
        uVar3 = 0xf;
        if (uVar22 != 0) {
          for (; uVar22 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar30 = (ushort)((uVar3 ^ 0xfff0) + 0x11) - 1;
      }
      FVar42.offset = uVar30 + uVar31 & uVar1;
      FVar42.probe_length = uVar27;
      i = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                    ((CommonFields *)this,uVar33,FVar42,
                     (PolicyFunctions *)GetPolicyFunctions()::value);
      iVar41 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
               ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                              *)this,i);
      bVar29 = true;
      uVar28 = uVar27;
    }
    uVar27 = uVar28;
    if (uVar22 != 0) {
      (__return_storage_ptr__->first).field_1 = iVar41.field_1;
      __return_storage_ptr__->second = bVar29;
      (__return_storage_ptr__->first).ctrl_ = iVar41.ctrl_;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

size_t capacity() const { return capacity_; }